

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

void __thiscall Klex::skipWhitespace(Klex *this)

{
  int iVar1;
  bool bVar2;
  char local_11;
  char c;
  Klex *this_local;
  
  iVar1 = getChar(this);
  local_11 = (char)iVar1;
  while( true ) {
    bVar2 = true;
    if (((local_11 != ' ') && (bVar2 = true, local_11 != '\t')) && (bVar2 = true, local_11 != '\n'))
    {
      bVar2 = local_11 == '\r';
    }
    if (!bVar2) break;
    if (local_11 == '\n') {
      this->lineNum = this->lineNum + 1;
      this->colNum = 0;
    }
    nextChar(this);
    iVar1 = getChar(this);
    local_11 = (char)iVar1;
  }
  return;
}

Assistant:

void Klex::skipWhitespace() {
    char c = getChar();

    while(c == ' ' || c == '\t' || c == '\n' || c == '\r') {
        if(c == '\n') {
            lineNum++;
            colNum = 0;
        }

        nextChar();
        c = getChar();
    }
}